

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

VMFunction * __thiscall FxVMFunctionCall::GetDirectFunction(FxVMFunctionCall *this)

{
  uint uVar1;
  uint uVar2;
  Variant *pVVar3;
  uint *puVar4;
  uint imp;
  FxVMFunctionCall *this_local;
  
  uVar1 = TArray<FxExpression_*,_FxExpression_*>::Size
                    (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
  if ((uVar1 == 0) &&
     (pVVar3 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                         (&this->Function->Variants,0), (pVVar3->Flags & 0x100) == 0)) {
    uVar1 = PFunction::GetImplicitArgs(this->Function);
    pVVar3 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&this->Function->Variants,0)
    ;
    uVar2 = TArray<unsigned_int,_unsigned_int>::Size(&pVVar3->ArgFlags);
    if (uVar1 < uVar2) {
      pVVar3 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                         (&this->Function->Variants,0);
      puVar4 = TArray<unsigned_int,_unsigned_int>::operator[](&pVVar3->ArgFlags,(ulong)uVar1);
      if ((*puVar4 & 1) == 0) {
        return (VMFunction *)0x0;
      }
    }
    pVVar3 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&this->Function->Variants,0)
    ;
    return pVVar3->Implementation;
  }
  return (VMFunction *)0x0;
}

Assistant:

VMFunction *FxVMFunctionCall::GetDirectFunction()
{
	// If this return statement calls a non-virtual function with no arguments,
	// then it can be a "direct" function. That is, the DECORATE
	// definition can call that function directly without wrapping
	// it inside VM code.
	if (ArgList.Size() == 0 && !(Function->Variants[0].Flags & VARF_Virtual))
	{
		unsigned imp = Function->GetImplicitArgs();
		if (Function->Variants[0].ArgFlags.Size() > imp && !(Function->Variants[0].ArgFlags[imp] & VARF_Optional)) return nullptr;
		return Function->Variants[0].Implementation;
	}
	
	return nullptr;
}